

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_eof(PHYSFS_File *handle)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  PHYSFS_sint64 len;
  PHYSFS_sint64 pos;
  PHYSFS_Io *io;
  FileHandle *fh;
  PHYSFS_File *handle_local;
  
  if (*(char *)&handle[1].opaque == '\0') {
    handle_local._4_4_ = 0;
  }
  else if (handle[6].opaque == handle[5].opaque) {
    pvVar1 = handle->opaque;
    lVar2 = (**(code **)((long)pvVar1 + 0x28))(pvVar1);
    lVar3 = (**(code **)((long)pvVar1 + 0x30))(pvVar1);
    if ((lVar2 < 0) || (lVar3 < 0)) {
      handle_local._4_4_ = 0;
    }
    else {
      handle_local._4_4_ = (uint)(lVar3 <= lVar2);
    }
  }
  else {
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int PHYSFS_eof(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;

    if (!fh->forReading)  /* never EOF on files opened for write/append. */
        return 0;

    /* can't be eof if buffer isn't empty */
    if (fh->bufpos == fh->buffill)
    {
        /* check the Io. */
        PHYSFS_Io *io = fh->io;
        const PHYSFS_sint64 pos = io->tell(io);
        const PHYSFS_sint64 len = io->length(io);
        if ((pos < 0) || (len < 0))
            return 0;  /* beats me. */
        return (pos >= len);
    } /* if */

    return 0;
}